

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::scgi::do_eof(scgi *this)

{
  error_code *in_RDI;
  error_code e;
  undefined1 local_18 [24];
  
  if (((ulong)in_RDI[0x18]._M_cat & 1) != 0) {
    booster::aio::basic_io_device::cancel();
  }
  *(undefined1 *)&in_RDI[0x18]._M_cat = 0;
  std::error_code::error_code(in_RDI);
  booster::aio::stream_socket::shutdown(&in_RDI[0x11]._M_cat,1,local_18);
  booster::aio::basic_io_device::close((error_code *)&in_RDI[0x11]._M_cat);
  return;
}

Assistant:

virtual void do_eof()
		{
			if(eof_callback_)
				socket_.cancel();
			eof_callback_ = false;
			booster::system::error_code e;
			socket_.shutdown(io::stream_socket::shut_wr,e);
			socket_.close(e);
		}